

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

object * floor_get_oldest_ignored(player *p,chunk *c,loc grid)

{
  _Bool _Var1;
  object *obj;
  object *poVar2;
  
  obj = square_object((chunk_conflict *)c,grid);
  poVar2 = (object *)0x0;
  for (; obj != (object *)0x0; obj = obj->next) {
    _Var1 = ignore_item_ok(p,obj);
    if (_Var1) {
      poVar2 = obj;
    }
  }
  return poVar2;
}

Assistant:

static struct object *floor_get_oldest_ignored(const struct player *p,
		struct chunk *c, struct loc grid)
{
	struct object *obj, *ignore = NULL;

	for (obj = square_object(c, grid); obj; obj = obj->next)
		if (ignore_item_ok(p, obj))
			ignore = obj;

	return ignore;
}